

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dtls-Example.cpp
# Opt level: O0

void ClientThread(bool *bStop)

{
  int local_17c;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  int local_16c;
  duration<long,_std::ratio<1L,_1000L>_> local_168;
  undefined1 local_159;
  anon_class_8_1_8991a0c2 aStack_158;
  bool bCreated;
  function<void_(UdpSocket_*)> local_150;
  function<void_(UdpSocket_*)> local_130;
  anon_class_1_0_00000001 local_109;
  function<void_(UdpSocket_*)> local_108;
  function<void_(UdpSocket_*)> local_e8;
  anon_class_8_1_b2e83c58 local_c8;
  function<void_(BaseSocket_*)> local_c0;
  function<void_(BaseSocket_*)> local_a0;
  anon_class_1_0_00000001 local_69;
  function<void_(BaseSocket_*)> local_68;
  function<void_(BaseSocket_*)> local_48;
  bool local_21;
  undefined1 local_20 [7];
  bool bIsClosed;
  SslUdpSocket sock;
  bool *bStop_local;
  
  sock.super_UdpSocket.super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<BaseSocketImpl,_std::default_delete<BaseSocketImpl>,_true,_true>)
       (__uniq_ptr_data<BaseSocketImpl,_std::default_delete<BaseSocketImpl>,_true,_true>)bStop;
  SslUdpSocket::SslUdpSocket((SslUdpSocket *)local_20);
  local_21 = false;
  std::function<void(BaseSocket*)>::function<ClientThread(bool_const*)::__0,void>
            ((function<void(BaseSocket*)> *)&local_68,&local_69);
  BaseSocket::BindErrorFunction(&local_48,(BaseSocket *)local_20,&local_68);
  std::function<void_(BaseSocket_*)>::~function(&local_48);
  std::function<void_(BaseSocket_*)>::~function(&local_68);
  local_c8.bIsClosed = &local_21;
  std::function<void(BaseSocket*)>::function<ClientThread(bool_const*)::__1,void>
            ((function<void(BaseSocket*)> *)&local_c0,&local_c8);
  BaseSocket::BindCloseFunction(&local_a0,(BaseSocket *)local_20,&local_c0);
  std::function<void_(BaseSocket_*)>::~function(&local_a0);
  std::function<void_(BaseSocket_*)>::~function(&local_c0);
  std::function<void(UdpSocket*)>::function<ClientThread(bool_const*)::__2,void>
            ((function<void(UdpSocket*)> *)&local_108,&local_109);
  UdpSocket::BindFuncBytesReceived(&local_e8,(UdpSocket *)local_20,&local_108);
  std::function<void_(UdpSocket_*)>::~function(&local_e8);
  std::function<void_(UdpSocket_*)>::~function(&local_108);
  aStack_158.sock = (SslUdpSocket *)local_20;
  std::function<void(UdpSocket*)>::function<ClientThread(bool_const*)::__3,void>
            ((function<void(UdpSocket*)> *)&local_150,&stack0xfffffffffffffea8);
  SslUdpSocket::BindFuncSslInitDone(&local_130,(SslUdpSocket *)local_20,&local_150);
  std::function<void_(UdpSocket_*)>::~function(&local_130);
  std::function<void_(UdpSocket_*)>::~function(&local_150);
  SslUdpSocket::AddCertificate
            ((SslUdpSocket *)local_20,"certs/client-cert.crt","certs/client-key.pem");
  local_159 = SslUdpSocket::CreateClientSide
                        ((SslUdpSocket *)local_20,"0.0.0.0",0x777,"127.0.0.1:3461",(char *)0x0);
  while ((*(byte *)sock.super_UdpSocket.super_BaseSocket.Impl_._M_t.
                   super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
                   super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
                   super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl & 1) == 0) {
    local_16c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_168,&local_16c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_168);
  }
  SslUdpSocket::Close((SslUdpSocket *)local_20);
  while ((local_21 & 1U) == 0) {
    local_17c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_178,&local_17c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_178);
  }
  SslUdpSocket::~SslUdpSocket((SslUdpSocket *)local_20);
  return;
}

Assistant:

void ClientThread(const bool* bStop)
{
    SslUdpSocket sock;
    bool bIsClosed = false;

    // 4 callback function to handle the client socket events
    sock.BindErrorFunction([&](BaseSocket*) { cout << "Client: socket error" << endl; });
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Client: socket closing" << endl; bIsClosed = true; });
    sock.BindFuncBytesReceived([&](UdpSocket* pUdpSocket)
    {
        const size_t nAvailable = pUdpSocket->GetBytesAvailable();

        auto spBuffer = make_unique<uint8_t[]>(nAvailable + 1);

        string strFrom;
        const size_t nRead = pUdpSocket->Read(spBuffer.get(), nAvailable, strFrom);

        if (nRead > 0)
        {
            string strRec(nRead, 0);
            copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

            stringstream strOutput;
            const auto tNow = chrono::system_clock::to_time_t(chrono::system_clock::now());
            struct tm stTime;
            if (localtime_s(&stTime, &tNow) == 0)
                strOutput << put_time(&stTime, "%a, %d %b %Y %H:%M:%S") << " - ";
            strOutput << strFrom.c_str() << " - Client received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

            cout << strOutput.str();
        }
    });

    sock.BindFuncSslInitDone([&](UdpSocket* pUdpSocket)
    {
        sock.Write("Hallo World", 11, "127.0.0.1:3461");
    });

    sock.AddCertificate("certs/client-cert.crt", "certs/client-key.pem");

    const bool bCreated = sock.CreateClientSide("0.0.0.0", 1911, "127.0.0.1:3461");

    while (*bStop == false)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    sock.Close();
    while (bIsClosed == false)
        this_thread::sleep_for(chrono::milliseconds(10));
}